

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall helics::apps::WebServer::stopServer(WebServer *this)

{
  string_view message;
  bool bVar1;
  undefined4 in_EAX;
  undefined4 in_register_00000004;
  char *unaff_RBX;
  undefined7 uStack_18;
  bool exp;
  
  uStack_18 = (undefined7)CONCAT44(in_register_00000004,in_EAX);
  exp = true;
  bVar1 = CLI::std::atomic<bool>::compare_exchange_strong(&this->running,&exp,false,seq_cst);
  if (bVar1) {
    message._M_len._7_1_ = exp;
    message._M_len._0_7_ = uStack_18;
    message._M_str = unaff_RBX;
    TypedBrokerServer::logMessage(message);
    CLI::std::mutex::lock(&this->threadGuard);
    boost::asio::io_context::stop
              (&((this->context).
                 super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                ioc);
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  }
  return;
}

Assistant:

void WebServer::stopServer()
{
    bool exp{true};
    if (running.compare_exchange_strong(exp, false)) {
        logMessage("stopping broker web server");
        const std::lock_guard<std::mutex> tlock(threadGuard);
        context->ioc.stop();
    }
}